

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  pointer pFVar1;
  uint uVar2;
  Regexp **ppRVar3;
  Regexp *pRVar4;
  pointer pSVar5;
  long lVar6;
  int iVar7;
  Regexp **ppRVar8;
  ulong uVar9;
  Regexp **sub_00;
  iterator iter;
  pointer pSVar10;
  int iVar11;
  int nsuffix;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  Regexp *re [2];
  vector<re2::Frame,_std::allocator<re2::Frame>_> local_1e8;
  int local_1c4;
  Regexp **local_1c0;
  undefined1 local_1b8 [392];
  
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c4 = nsub;
  local_1c0 = sub;
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&local_1c0,&local_1c4);
LAB_001bef18:
  do {
    pFVar1 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar10 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].splices.
              super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar5 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].splices.
             super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar10 != pSVar5) {
      iVar11 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].spliceidx;
      iVar7 = (int)((ulong)((long)pSVar5 - (long)pSVar10) >> 3);
      if (SBORROW4(iVar11,iVar7 * -0x55555555) != iVar11 + iVar7 * 0x55555555 < 0) {
        std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
                  ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&pSVar10[iVar11].sub,
                   &pSVar10[iVar11].nsub);
        goto LAB_001bef18;
      }
      if (0 < local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].nsub) {
        iVar11 = 0;
        uVar9 = 0;
LAB_001bef74:
        ppRVar3 = pFVar1[-1].sub;
        ppRVar8 = ppRVar3 + iVar11;
        sub_00 = pSVar10->sub;
        if (ppRVar8 < sub_00) {
          uVar9 = (ulong)(int)uVar9;
          lVar6 = (long)iVar11 << 3;
          do {
            ppRVar3[uVar9] = *ppRVar8;
            uVar9 = uVar9 + 1;
            ppRVar3 = pFVar1[-1].sub;
            ppRVar8 = (Regexp **)((long)ppRVar3 + lVar6 + 8);
            sub_00 = pSVar10->sub;
            iVar11 = iVar11 + 1;
            lVar6 = lVar6 + 8;
          } while (ppRVar8 < sub_00);
        }
        iVar7 = (int)uVar9;
        if (pFVar1[-1].round - 1U < 2) {
          local_1b8._0_8_ = pSVar10->prefix;
          local_1b8._8_8_ = AlternateNoFactor(sub_00,pSVar10->nsuffix,flags);
          pRVar4 = Concat((Regexp **)local_1b8,2,flags);
          pFVar1[-1].sub[iVar7] = pRVar4;
LAB_001bf00f:
          uVar9 = (ulong)(iVar7 + 1);
          iVar11 = iVar11 + pSVar10->nsub;
        }
        else {
          if (pFVar1[-1].round == 3) {
            ppRVar3[iVar7] = pSVar10->prefix;
            goto LAB_001bf00f;
          }
          LogMessage::LogMessage
                    ((LogMessage *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                     ,0x3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 8),"unknown round: ",0xf);
          std::ostream::operator<<((ostream *)(local_1b8 + 8),pFVar1[-1].round);
          LogMessage::~LogMessage((LogMessage *)local_1b8);
        }
        pSVar10 = pSVar10 + 1;
        iVar7 = pFVar1[-1].nsub;
        if ((pSVar10 !=
             pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
             _M_impl.super__Vector_impl_data._M_finish) || (iVar7 <= iVar11)) break;
        lVar6 = (long)iVar11;
        uVar9 = (ulong)(int)uVar9;
        do {
          ppRVar8 = pFVar1[-1].sub + lVar6;
          lVar6 = lVar6 + 1;
          pFVar1[-1].sub[uVar9] = *ppRVar8;
          uVar9 = uVar9 + 1;
        } while (iVar7 != lVar6);
LAB_001bf09c:
        iVar11 = (int)uVar9;
        pSVar10 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar5 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_001bf0a9;
      }
      iVar11 = 0;
LAB_001bf0a9:
      if (pSVar5 != pSVar10) {
        pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar10;
      }
      pFVar1[-1].nsub = iVar11;
    }
    uVar2 = pFVar1[-1].round;
    pFVar1[-1].round = uVar2 + 1;
    if (3 < uVar2) {
      LogMessage::LogMessage
                ((LogMessage *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                 ,0x3f7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 8),"unknown round: ",0xf);
      std::ostream::operator<<((ostream *)(local_1b8 + 8),pFVar1[-1].round);
      LogMessage::~LogMessage((LogMessage *)local_1b8);
      goto LAB_001bf1a5;
    }
    splices = &pFVar1[-1].splices;
    switch(uVar2) {
    case 0:
      FactorAlternationImpl::Round1(pFVar1[-1].sub,pFVar1[-1].nsub,0x3032d8,splices);
      break;
    case 1:
      FactorAlternationImpl::Round2(pFVar1[-1].sub,pFVar1[-1].nsub,0x3032d8,splices);
      break;
    case 2:
      FactorAlternationImpl::Round3(pFVar1[-1].sub,pFVar1[-1].nsub,flags,splices);
      break;
    case 3:
      goto switchD_001bf0dd_caseD_3;
    }
LAB_001bf1a5:
    pSVar10 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar5 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pSVar10 == pSVar5) || (iVar11 = 0, pFVar1[-1].round == 3)) {
      iVar11 = (int)((ulong)((long)pSVar5 - (long)pSVar10) >> 3) * -0x55555555;
    }
    pFVar1[-1].spliceidx = iVar11;
  } while( true );
  if (iVar7 <= iVar11) goto LAB_001bf09c;
  goto LAB_001bef74;
switchD_001bf0dd_caseD_3:
  iVar11 = pFVar1[-1].nsub;
  if ((long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_start == 0x30) {
    std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector(&local_1e8);
    return iVar11;
  }
  pFVar1 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  pSVar10 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].splices.
            super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar1;
  if (pSVar10 != (pointer)0x0) {
    operator_delete(pSVar10);
  }
  iVar7 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].spliceidx;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].splices.
  super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar7].nsuffix = iVar11;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].spliceidx = iVar7 + 1;
  goto LAB_001bef18;
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}